

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O1

Action __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
::acceptVisitor(CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                *this,SyntaxVisitor *visitor)

{
  ExtGNU_AsmOperandSyntax *this_00;
  Action AVar1;
  CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
  *it;
  
  while ((this_00 = (((SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*> *)this)->
                    super_CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                    ).
                    super_List<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                    .value, this_00 == (ExtGNU_AsmOperandSyntax *)0x0 ||
         (AVar1 = SyntaxNode::acceptVisitor(&this_00->super_SyntaxNode,visitor), AVar1 != Quit))) {
    this = &((((SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*> *)this)->
             super_CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
             ).
             super_List<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
            .next)->
            super_CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
    ;
    if ((SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*> *)this ==
        (SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*> *)0x0) {
      return Visit;
    }
  }
  return Quit;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }